

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte bVar1;
  u16 uVar2;
  short sVar3;
  int iVar4;
  Table *pTab;
  sqlite3 *db;
  Column *pCVar5;
  Index *pIdx;
  LogEst LVar6;
  uint uVar7;
  int p2;
  void *pvVar8;
  Vdbe *pVVar9;
  Parse *pPVar10;
  Token *pTVar11;
  Table *pTable;
  char *pcVar12;
  size_t sVar13;
  Expr *pExpr;
  ExprList *pList;
  ushort uVar14;
  int iVar15;
  Op *pOVar16;
  short sVar17;
  Schema **ppSVar18;
  u8 *puVar19;
  long lVar20;
  uint uVar21;
  char *pcVar22;
  ulong uVar23;
  short *psVar24;
  short *psVar25;
  int iVar26;
  ulong uVar27;
  Index *pIVar28;
  int iVar29;
  bool bVar30;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (((db->init).busy != '\0') && (iVar15 = (db->init).newTnum, pTab->tnum = iVar15, iVar15 == 1))
  {
    pTab->tabFlags = pTab->tabFlags | 1;
  }
  if ((tabOpts & 0x20) != 0) {
    bVar1 = pTab->tabFlags;
    if ((bVar1 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if ((bVar1 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = bVar1 | 0x60;
      pVVar9 = pParse->pVdbe;
      if (((db->init).imposterTable == '\0') && (sVar17 = pTab->nCol, 0 < (long)sVar17)) {
        pCVar5 = pTab->aCol;
        lVar20 = 0;
        do {
          if (((&pCVar5->colFlags)[lVar20] & 1) != 0) {
            (&pCVar5->notNull)[lVar20] = '\x02';
          }
          lVar20 = lVar20 + 0x20;
        } while ((long)sVar17 * 0x20 != lVar20);
      }
      if (pParse->declareVtab == '\0') {
        iVar15 = pParse->addrCrTab;
        if (iVar15 != 0) {
          if (iVar15 < 0) {
            iVar15 = pVVar9->nOp + -1;
          }
          if (pVVar9->db->mallocFailed == '\0') {
            pOVar16 = pVVar9->aOp + iVar15;
          }
          else {
            pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar16->opcode = 0x85;
        }
        if ((long)pTab->iPKey < 0) {
          for (pIVar28 = pTab->pIndex; pIVar28 != (Index *)0x0; pIVar28 = pIVar28->pNext) {
            if ((pIVar28->field_0x63 & 3) == 2) goto LAB_0014517b;
          }
          pIVar28 = (Index *)0x0;
LAB_0014517b:
          if (pVVar9 != (Vdbe *)0x0) {
            iVar15 = pIVar28->tnum;
            if (iVar15 < 0) {
              iVar15 = pVVar9->nOp + -1;
            }
            if (pVVar9->db->mallocFailed == '\0') {
              pOVar16 = pVVar9->aOp + iVar15;
            }
            else {
              pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar16->opcode = '\r';
          }
          uVar14 = pIVar28->nKeyCol;
          iVar15 = 1;
          if (1 < uVar14) {
            psVar24 = pIVar28->aiColumn;
            iVar15 = 1;
            uVar27 = 1;
            do {
              psVar25 = psVar24;
              iVar26 = iVar15;
              do {
                if (iVar26 < 1) {
                  lVar20 = (long)iVar15;
                  iVar15 = iVar15 + 1;
                  psVar24[lVar20] = psVar24[uVar27];
                  uVar14 = pIVar28->nKeyCol;
                  goto LAB_001452b7;
                }
                iVar26 = iVar26 + -1;
                sVar17 = *psVar25;
                psVar25 = psVar25 + 1;
              } while (sVar17 != psVar24[uVar27]);
              pIVar28->nColumn = pIVar28->nColumn - 1;
LAB_001452b7:
              uVar27 = uVar27 + 1;
            } while (uVar27 < uVar14);
          }
          pIVar28->nKeyCol = (u16)iVar15;
        }
        else {
          dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
          if ((char *)dest._0_8_ == (char *)0x0) {
            uVar7 = 0;
          }
          else {
            sVar13 = strlen((char *)dest._0_8_);
            uVar7 = (uint)sVar13 & 0x3fffffff;
          }
          dest.zAffSdst = (char *)CONCAT44(dest.zAffSdst._4_4_,uVar7);
          pExpr = sqlite3ExprAlloc(db,0x37,(Token *)&dest,0);
          pList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
          if (pList == (ExprList *)0x0) goto LAB_00144b04;
          pList->a->sortOrder = pParse->iPkSortOrder;
          sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                             (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
          if (db->mallocFailed != '\0') goto LAB_00144b04;
          for (pIVar28 = pTab->pIndex; pIVar28 != (Index *)0x0; pIVar28 = pIVar28->pNext) {
            if ((pIVar28->field_0x63 & 3) == 2) goto LAB_0014524c;
          }
          pIVar28 = (Index *)0x0;
LAB_0014524c:
          pTab->iPKey = -1;
        }
        bVar1 = pIVar28->field_0x63;
        pIVar28->field_0x63 = bVar1 | 0x20;
        if ((db->init).imposterTable == '\0') {
          pIVar28->field_0x63 = bVar1 | 0x28;
        }
        uVar14 = pIVar28->nKeyCol;
        uVar27 = (ulong)uVar14;
        pIVar28->tnum = pTab->tnum;
        for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
          if ((pIdx->field_0x63 & 3) != 2) {
            if (uVar27 != 0) {
              uVar23 = 0;
              iVar15 = 0;
              do {
                uVar7 = (uint)pIdx->nKeyCol;
                psVar24 = pIdx->aiColumn;
                do {
                  if ((int)uVar7 < 1) {
                    iVar15 = iVar15 + 1;
                    break;
                  }
                  uVar7 = uVar7 - 1;
                  sVar17 = *psVar24;
                  psVar24 = psVar24 + 1;
                } while (sVar17 != pIVar28->aiColumn[uVar23]);
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar27);
              if (iVar15 != 0) {
                iVar15 = resizeIndexObject(db,pIdx,iVar15 + (uint)pIdx->nKeyCol);
                if (iVar15 == 0) {
                  if (uVar27 != 0) {
                    uVar7 = (uint)pIdx->nKeyCol;
                    uVar23 = 0;
                    do {
                      uVar21 = (uint)pIdx->nKeyCol;
                      psVar24 = pIdx->aiColumn;
                      do {
                        if ((int)uVar21 < 1) {
                          pIdx->aiColumn[(int)uVar7] = pIVar28->aiColumn[uVar23];
                          pIdx->azColl[(int)uVar7] = pIVar28->azColl[uVar23];
                          uVar7 = uVar7 + 1;
                          break;
                        }
                        uVar21 = uVar21 - 1;
                        sVar17 = *psVar24;
                        psVar24 = psVar24 + 1;
                      } while (sVar17 != pIVar28->aiColumn[uVar23]);
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar27);
                  }
                  goto LAB_001453e0;
                }
                goto LAB_00144b04;
              }
            }
            pIdx->nColumn = pIdx->nKeyCol;
          }
LAB_001453e0:
        }
        uVar2 = pTab->nCol;
        if ((int)(uint)uVar14 < (int)(short)uVar2) {
          iVar15 = resizeIndexObject(db,pIVar28,(int)(short)uVar2);
          if ((iVar15 == 0) && (sVar17 = pTab->nCol, 0 < sVar17)) {
            iVar15 = 0;
            do {
              iVar26 = (int)uVar27;
              psVar24 = pIVar28->aiColumn;
              uVar23 = uVar27;
              do {
                if ((int)uVar23 < 1) {
                  pIVar28->aiColumn[iVar26] = (short)iVar15;
                  pIVar28->azColl[iVar26] = "BINARY";
                  uVar27 = (ulong)(iVar26 + 1);
                  sVar17 = pTab->nCol;
                  break;
                }
                uVar23 = (ulong)((int)uVar23 - 1);
                sVar3 = *psVar24;
                psVar24 = psVar24 + 1;
              } while (iVar15 != sVar3);
              iVar15 = iVar15 + 1;
            } while (iVar15 < sVar17);
          }
        }
        else {
          pIVar28->nColumn = uVar2;
        }
      }
    }
  }
LAB_00144b04:
  if (pTab->pSchema == (Schema *)0x0) {
    uVar27 = 0xfff0bdc0;
  }
  else {
    uVar7 = db->nDb;
    if ((int)uVar7 < 1) {
      uVar27 = 0;
    }
    else {
      ppSVar18 = &db->aDb->pSchema;
      uVar27 = 0;
      do {
        if (*ppSVar18 == pTab->pSchema) goto LAB_00144b8f;
        uVar27 = uVar27 + 1;
        ppSVar18 = ppSVar18 + 4;
      } while (uVar7 != uVar27);
      uVar27 = (ulong)uVar7;
    }
  }
LAB_00144b8f:
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar15 = 0;
  }
  else {
    uVar7 = (int)pTab->nCol + 1;
    puVar19 = &pTab->aCol->szEst;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + (uint)*puVar19;
      uVar7 = uVar7 - 1;
      puVar19 = puVar19 + 0x20;
    } while (1 < uVar7);
  }
  LVar6 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar15) * 4));
  pTab->szTabRow = LVar6;
  for (pIVar28 = pTab->pIndex; pIVar28 != (Index *)0x0; pIVar28 = pIVar28->pNext) {
    estimateIndexWidth(pIVar28);
  }
  if ((db->init).busy == '\0') {
    pVVar9 = pParse->pVdbe;
    if ((pVVar9 == (Vdbe *)0x0) && (pVVar9 = allocVdbe(pParse), pVVar9 == (Vdbe *)0x0)) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar9,0x6f,0,0,0);
    bVar30 = pTab->pSelect == (Select *)0x0;
    pcVar12 = "CREATE_VIEW";
    if (bVar30) {
      pcVar12 = "CREATE_TABLE";
    }
    pcVar22 = "view";
    if (bVar30) {
      pcVar22 = "table";
    }
    iVar15 = (int)uVar27;
    if (pSelect == (Select *)0x0) {
      pTVar11 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar11 = pEnd;
      }
      uVar7 = (int)pTVar11->z - (int)(pParse->sNameToken).z;
      if (*pTVar11->z != ';') {
        uVar7 = uVar7 + pTVar11->n;
      }
      pcVar12 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar12 + 7,(ulong)uVar7);
    }
    else {
      iVar26 = pParse->nMem;
      iVar29 = iVar26 + 1;
      p2 = iVar26 + 3;
      pParse->nMem = p2;
      pPVar10 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar10 = pParse;
      }
      pPVar10->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar9,0x69,1,pParse->regRoot,iVar15);
      iVar4 = pVVar9->nOp;
      if (0 < (long)iVar4) {
        pVVar9->aOp[(long)iVar4 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar9,0xf,iVar29,0,iVar4 + 1);
      dest.eDest = '\r';
      dest.zAffSdst = (char *)0x0;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.iSDParm = iVar29;
      sqlite3Select(pParse,pSelect,&dest);
      sqlite3VdbeAddOp3(pVVar9,0x49,iVar29,0,0);
      pPVar10 = pVVar9->pParse;
      pPVar10->nTempReg = '\0';
      pPVar10->nRangeReg = 0;
      if (pVVar9->db->mallocFailed == '\0') {
        iVar29 = pVVar9->nOp + -1;
        if (-1 < iVar4) {
          iVar29 = iVar4;
        }
        pOVar16 = pVVar9->aOp + iVar29;
      }
      else {
        pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar16->p2 = pVVar9->nOp;
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      iVar29 = sqlite3VdbeAddOp3(pVVar9,0x10,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar9,99,dest.iSdst,dest.nSdst,iVar26 + 2);
      sqlite3TableAffinity(pVVar9,pTab,0);
      sqlite3VdbeAddOp3(pVVar9,0x72,1,p2,0);
      sqlite3VdbeAddOp3(pVVar9,0x73,1,iVar26 + 2,p2);
      sqlite3VdbeAddOp3(pVVar9,0xd,0,iVar29,0);
      if (pVVar9->db->mallocFailed == '\0') {
        iVar26 = pVVar9->nOp + -1;
        if (-1 < iVar29) {
          iVar26 = iVar29;
        }
        pOVar16 = pVVar9->aOp + iVar26;
      }
      else {
        pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar16->p2 = pVVar9->nOp;
      sqlite3VdbeAddOp3(pVVar9,0x6f,1,0,0);
      pcVar12 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar15].zDbSName,"sqlite_master",pcVar22,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar12,(ulong)(uint)pParse->regRowid);
    sqlite3DbFree(db,pcVar12);
    sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iVar15,1,
                      (pParse->db->aDb[iVar15].pSchema)->schema_cookie + 1);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar15].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar15].zDbSName
                        );
    }
    pcVar12 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar9,iVar15,pcVar12);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar8 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar8 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    *(byte *)&db->flags = (byte)db->flags | 2;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar12 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar15 = sqlite3Utf8CharLen(pcVar12,*(int *)&pEnd->z - (int)pcVar12);
      pTab->addColOffset = iVar15 + 0xd;
    }
  }
  else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}